

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_drop_unknown_fields.pb.cc
# Opt level: O3

void unittest_drop_unknown_fields::FooWithExtraFields::MergeImpl
               (MessageLite *to_msg,MessageLite *from_msg)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  
  if (from_msg == to_msg) {
    MergeImpl();
  }
  uVar1 = *(uint *)&from_msg[1]._vptr_MessageLite;
  if ((uVar1 & 7) != 0) {
    if (((uVar1 & 1) != 0) && (iVar2 = (int)from_msg[1]._internal_metadata_.ptr_, iVar2 != 0)) {
      *(int *)&to_msg[1]._internal_metadata_.ptr_ = iVar2;
    }
    if (((uVar1 & 2) != 0) &&
       (iVar2 = *(int *)((long)&from_msg[1]._internal_metadata_.ptr_ + 4), iVar2 != 0)) {
      *(int *)((long)&to_msg[1]._internal_metadata_.ptr_ + 4) = iVar2;
    }
    if (((uVar1 & 4) != 0) && (*(int *)&from_msg[2]._vptr_MessageLite != 0)) {
      *(int *)&to_msg[2]._vptr_MessageLite = *(int *)&from_msg[2]._vptr_MessageLite;
    }
  }
  *(uint *)&to_msg[1]._vptr_MessageLite = *(uint *)&to_msg[1]._vptr_MessageLite | uVar1;
  uVar3 = (from_msg->_internal_metadata_).ptr_;
  if ((uVar3 & 1) == 0) {
    return;
  }
  google::protobuf::internal::InternalMetadata::DoMergeFrom<google::protobuf::UnknownFieldSet>
            (&to_msg->_internal_metadata_,(UnknownFieldSet *)((uVar3 & 0xfffffffffffffffe) + 8));
  return;
}

Assistant:

void FooWithExtraFields::MergeImpl(::google::protobuf::MessageLite& to_msg, const ::google::protobuf::MessageLite& from_msg) {
  auto* const _this = static_cast<FooWithExtraFields*>(&to_msg);
  auto& from = static_cast<const FooWithExtraFields&>(from_msg);
  // @@protoc_insertion_point(class_specific_merge_from_start:unittest_drop_unknown_fields.FooWithExtraFields)
  ABSL_DCHECK_NE(&from, _this);
  ::uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = from._impl_._has_bits_[0];
  if ((cached_has_bits & 0x00000007u) != 0) {
    if ((cached_has_bits & 0x00000001u) != 0) {
      if (from._internal_int32_value() != 0) {
        _this->_impl_.int32_value_ = from._impl_.int32_value_;
      }
    }
    if ((cached_has_bits & 0x00000002u) != 0) {
      if (from._internal_enum_value() != 0) {
        _this->_impl_.enum_value_ = from._impl_.enum_value_;
      }
    }
    if ((cached_has_bits & 0x00000004u) != 0) {
      if (from._internal_extra_int32_value() != 0) {
        _this->_impl_.extra_int32_value_ = from._impl_.extra_int32_value_;
      }
    }
  }
  _this->_impl_._has_bits_[0] |= cached_has_bits;
  _this->_internal_metadata_.MergeFrom<::google::protobuf::UnknownFieldSet>(from._internal_metadata_);
}